

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigTable.c
# Opt level: O1

int Fraig_HashTableLookupS
              (Fraig_Man_t *pMan,Fraig_Node_t *p1,Fraig_Node_t *p2,Fraig_Node_t **ppNodeRes)

{
  uint uVar1;
  Fraig_HashTable_t *pFVar2;
  Fraig_Node_t **ppFVar3;
  uint uVar4;
  Fraig_Node_t *pFVar5;
  Fraig_Node_t **ppFVar6;
  ulong uVar7;
  Fraig_Node_t *pFVar8;
  Fraig_Node_t *pFVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  Fraig_Node_t *pFVar16;
  timespec ts;
  timespec local_40;
  
  pFVar9 = p1;
  if (*(int *)((ulong)p2 & 0xfffffffffffffffe) < *(int *)((ulong)p1 & 0xfffffffffffffffe)) {
    pFVar9 = p2;
    p2 = p1;
  }
  pFVar2 = pMan->pTableS;
  uVar14 = (long)p2 * 0xc00005 + (long)pFVar9;
  iVar10 = pFVar2->nBins;
  uVar11 = uVar14 % (ulong)(long)iVar10;
  for (pFVar5 = pFVar2->pBins[uVar11 & 0xffffffff]; pFVar5 != (Fraig_Node_t *)0x0;
      pFVar5 = pFVar5->pNextS) {
    if ((pFVar5->p1 == pFVar9) && (pFVar5->p2 == p2)) {
      *ppNodeRes = pFVar5;
      return 1;
    }
  }
  if (SBORROW4(pFVar2->nEntries,iVar10 * 2) == pFVar2->nEntries + iVar10 * -2 < 0) {
    clock_gettime(3,&local_40);
    uVar1 = pFVar2->nBins;
    uVar12 = uVar1 * 2 - 1;
    while( true ) {
      do {
        uVar13 = uVar12 + 1;
        uVar4 = uVar12 & 1;
        uVar12 = uVar13;
      } while (uVar4 != 0);
      if (uVar13 < 9) break;
      iVar10 = 5;
      while (uVar13 % (iVar10 - 2U) != 0) {
        uVar4 = iVar10 * iVar10;
        iVar10 = iVar10 + 2;
        if (uVar13 < uVar4) goto LAB_005ec202;
      }
    }
LAB_005ec202:
    uVar11 = (ulong)(int)uVar13;
    ppFVar6 = (Fraig_Node_t **)malloc(uVar11 * 8);
    iVar10 = 0;
    memset(ppFVar6,0,uVar11 * 8);
    if (0 < (int)uVar1) {
      ppFVar3 = pFVar2->pBins;
      uVar15 = 0;
      iVar10 = 0;
      do {
        pFVar5 = ppFVar3[uVar15];
        if (pFVar5 != (Fraig_Node_t *)0x0) {
          pFVar8 = pFVar5->pNextS;
          do {
            pFVar16 = pFVar8;
            uVar7 = (ulong)((long)pFVar5->p2 * 0xc00005 + (long)pFVar5->p1) % uVar11 & 0xffffffff;
            pFVar5->pNextS = ppFVar6[uVar7];
            ppFVar6[uVar7] = pFVar5;
            pFVar8 = (Fraig_Node_t *)0x0;
            if (pFVar16 != (Fraig_Node_t *)0x0) {
              pFVar8 = pFVar16->pNextS;
            }
            iVar10 = iVar10 + 1;
            pFVar5 = pFVar16;
          } while (pFVar16 != (Fraig_Node_t *)0x0);
        }
        uVar15 = uVar15 + 1;
      } while (uVar15 != uVar1);
    }
    if (iVar10 != pFVar2->nEntries) {
      __assert_fail("Counter == p->nEntries",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fraig/fraigTable.c"
                    ,0x11b,"void Fraig_TableResizeS(Fraig_HashTable_t *)");
    }
    if (pFVar2->pBins != (Fraig_Node_t **)0x0) {
      free(pFVar2->pBins);
      pFVar2->pBins = (Fraig_Node_t **)0x0;
    }
    pFVar2->pBins = ppFVar6;
    pFVar2->nBins = uVar13;
    uVar11 = uVar14 % uVar11;
  }
  pFVar9 = Fraig_NodeCreate(pMan,pFVar9,p2);
  ppFVar6 = pFVar2->pBins;
  pFVar9->pNextS = ppFVar6[uVar11 & 0xffffffff];
  ppFVar6[uVar11 & 0xffffffff] = pFVar9;
  *ppNodeRes = pFVar9;
  pFVar2->nEntries = pFVar2->nEntries + 1;
  return 0;
}

Assistant:

int Fraig_HashTableLookupS( Fraig_Man_t * pMan, Fraig_Node_t * p1, Fraig_Node_t * p2, Fraig_Node_t ** ppNodeRes )
{
    Fraig_HashTable_t * p = pMan->pTableS;
    Fraig_Node_t * pEnt;
    unsigned Key;

    // order the arguments
    if ( Fraig_Regular(p1)->Num > Fraig_Regular(p2)->Num )
        pEnt = p1, p1 = p2, p2 = pEnt;

    Key = Fraig_HashKey2( p1, p2, p->nBins );
    Fraig_TableBinForEachEntryS( p->pBins[Key], pEnt )
        if ( pEnt->p1 == p1 && pEnt->p2 == p2 )
        {
            *ppNodeRes = pEnt;
            return 1;
        }
    // check if it is a good time for table resizing
    if ( p->nEntries >= 2 * p->nBins )
    {
        Fraig_TableResizeS( p );
        Key = Fraig_HashKey2( p1, p2, p->nBins );
    }
    // create the new node
    pEnt = Fraig_NodeCreate( pMan, p1, p2 );
    // add the node to the corresponding linked list in the table
    pEnt->pNextS = p->pBins[Key];
    p->pBins[Key] = pEnt;
    *ppNodeRes = pEnt;
    p->nEntries++;
    return 0;
}